

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot value,uint32 slotIndex,ViewType viewType
          )

{
  bool bVar1;
  uint local_2b;
  uchar uStack_27;
  ViewType VStack_26;
  ViewType local_25;
  undefined1 uStack_24;
  OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  ViewType viewType_local;
  uint32 slotIndex_local;
  RegSlot value_local;
  OpCodeAsmJs op_local;
  AsmJsByteCodeWriter *this_local;
  
  local_25 = viewType;
  _uStack_24 = slotIndex;
  unique0x100000a6 = value;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>(&uStack_27,value);
  if (((bVar1) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::
               Assign<Js::ArrayBufferView::ViewType,Js::ArrayBufferView::ViewType>
                         (&VStack_26,local_25), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_int,unsigned_int>
                        (&local_2b,_uStack_24), bVar1)) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_2b,6,
               &this->super_ByteCodeWriter,false);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmTypedArr(OpCodeAsmJs op, RegSlot value, uint32 slotIndex, ArrayBufferView::ViewType viewType)
    {
        OpLayoutT_AsmTypedArr<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::template Assign<ArrayBufferView::ViewType>(layout.ViewType, viewType)
            && SizePolicy::Assign(layout.SlotIndex, slotIndex))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }